

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * Pathie::Path::make_tempname(string *__return_storage_ptr__,string *namepart)

{
  pointer pcVar1;
  __pid_t _Var2;
  int iVar3;
  tm *__tp;
  long lVar4;
  char buf [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string randompart;
  string pidpart;
  string timepart;
  time_t now;
  stringstream ss;
  undefined7 local_288;
  char cStack_281;
  undefined7 uStack_280;
  undefined1 uStack_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  time_t local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  time(&local_1b8);
  __tp = localtime(&local_1b8);
  local_288 = 0;
  cStack_281 = '\0';
  uStack_280 = 0;
  uStack_279 = 0;
  strftime((char *)&local_288,0x10,"%Y%m%d-%H%M%S",__tp);
  local_1d8.field_2._M_allocated_capacity._0_7_ = local_288;
  local_1d8.field_2._M_local_buf[7] = cStack_281;
  local_1d8.field_2._8_7_ = uStack_280;
  local_1d8._M_string_length = 0xf;
  local_1d8.field_2._M_local_buf[0xf] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::stringstream::stringstream(local_1b0);
  _Var2 = getpid();
  std::ostream::operator<<(local_1a0,_Var2);
  std::__cxx11::stringbuf::str();
  local_288 = 0;
  cStack_281 = '\0';
  uStack_280 = 0;
  uStack_279 = 0;
  lVar4 = 0;
  do {
    iVar3 = rand();
    *(char *)((long)&local_288 + lVar4) = (char)iVar3 + (char)(iVar3 / 0x1a) * -0x1a + 'a';
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  local_218.field_2._M_allocated_capacity._0_7_ = local_288;
  local_218.field_2._M_local_buf[7] = cStack_281;
  local_218.field_2._8_7_ = uStack_280;
  local_218._M_string_length = 0xf;
  local_218.field_2._M_local_buf[0xf] = '\0';
  pcVar1 = (namepart->_M_dataplus)._M_p;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar1,pcVar1 + namepart->_M_string_length);
  std::__cxx11::string::append((char *)&local_278);
  std::operator+(&local_258,&local_278,&local_1d8);
  std::operator+(&local_238,&local_258,&local_1f8);
  std::operator+(__return_storage_ptr__,&local_238,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Path::make_tempname(const std::string& namepart)
{
  time_t now;
  struct tm* p_nowinfo = NULL;
  time(&now);
  p_nowinfo = localtime(&now);

  char buf[16]; // 15 + NUL
  memset(buf, '\0', 16);
  strftime(buf, 16, "%Y%m%d-%H%M%S", p_nowinfo);
  std::string timepart(buf, 15);

#if defined(_PATHIE_UNIX)
  std::stringstream ss;
  ss << getpid();
  std::string pidpart = ss.str();
#elif defined(_WIN32)
  std::stringstream ss;
  ss << GetCurrentProcessId();
  std::string pidpart = ss.str();
#else
#error Unsupported system.
#endif

  memset(buf, '\0', 16);
  short i;
  for(i=0; i < 16; i++)
    buf[i] = 97 + rand() % 26; // Random char between a and z

  std::string randompart(buf, 15);

  return namepart + "_" + timepart + pidpart + randompart;
}